

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQClass *c,SQInteger memsize)

{
  uint uVar1;
  long lVar2;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = 0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQInstance_0019a198;
  this->_values[0].super_SQObject._type = 0;
  this->_values[0].super_SQObject._flags = '\0';
  *(undefined3 *)&this->_values[0].super_SQObject.field_0x5 = 0;
  this->_values[0].super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_values[0].super_SQObject._type = OT_NULL;
  this->_memsize = memsize;
  this->_class = c;
  uVar1 = (c->_defaultvalues)._size;
  for (lVar2 = 0; (ulong)uVar1 << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    SQObjectPtr::SQObjectPtr
              ((SQObjectPtr *)((long)&this->_values[0].super_SQObject._type + lVar2),
               (SQObjectPtr *)
               ((long)&(((this->_class->_defaultvalues)._vals)->val).super_SQObject._type + lVar2));
  }
  Init(this,ss);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQClass *c, SQInteger memsize)
{
    _memsize = memsize;
    _class = c;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(_class->_defaultvalues[n].val);
    }
    Init(ss);
}